

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  char *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attr;
  lexer lex;
  string input;
  iterator iter;
  iterator theEnd;
  undefined1 local_60 [64];
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Need something to parse\n");
    return 1;
  }
  std::__cxx11::string::string((string *)&input,argv[1],(allocator *)&iter);
  poVar3 = std::operator<<((ostream *)&std::cout,"Parsing : ");
  poVar3 = std::operator<<(poVar3,(string *)&input);
  std::operator<<(poVar3,"\n");
  iter.m_end._M_current = input._M_dataplus._M_p;
  theEnd.m_end._M_current = input._M_dataplus._M_p + input._M_string_length;
  lexer::lexer(&lex,&iter.m_end,&theEnd.m_end);
  lexer::begin(&iter,&lex);
  lexer::iterator::iterator(&theEnd,&lex.m_end);
  attr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lexer::iterator::iterator((iterator *)local_60,&theEnd);
  bVar2 = boost::spirit::x3::
          parse<lexer::iterator,boost::spirit::x3::plus<boost::spirit::x3::alternative<boost::spirit::x3::sequence<boost::spirit::x3::sequence<tok_kw,tok_sym>,tok_kw>,boost::spirit::x3::sequence<boost::spirit::x3::sequence<boost::spirit::x3::sequence<boost::spirit::x3::sequence<tok_kw,tok_sym>,tok_kw>,tok_kw>,tok_kw>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&iter,(iterator *)local_60,&program,&attr);
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  if (bVar2) {
    bVar2 = lexer::iterator::operator!=(&iter,&theEnd);
    if (!bVar2) {
      std::operator<<((ostream *)&std::cout,"SUCCESS: Good Input\n");
      pbVar1 = attr.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = attr.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
        std::operator<<(poVar3,"\n");
      }
      iVar4 = 0;
      goto LAB_0010256c;
    }
    pcVar6 = "FAILED: didn\'t parse all the output\n";
  }
  else {
    pcVar6 = "FAILED: returned failure\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar6);
  iVar4 = 1;
LAB_0010256c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&attr);
  std::__cxx11::string::~string((string *)&theEnd.m_curr_tok.lexeme);
  std::__cxx11::string::~string((string *)&iter.m_curr_tok.lexeme);
  std::__cxx11::string::~string((string *)&input);
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 2) {
        std::cout << "Need something to parse\n";
        return 1;
    }

    std::string input(argv[1]);
    auto ibeg = input.begin();
    auto iend = input.end();
    
    std::cout << "Parsing : " << input << "\n";
    lexer lex(ibeg, iend);
    
    auto iter = lex.begin();
    auto theEnd = lex.end();

    std::vector<std::string> attr;
    
    
    bool r = x3::parse(iter, theEnd, program, attr);
    if (r) {
        if (iter != theEnd) {
            std::cout << "FAILED: didn't parse all the output\n";
            return 1;
        } else {
            std::cout << "SUCCESS: Good Input\n";
            for (auto const&a : attr) {
                std::cout << a << "\n";
            }
            return 0;
        }
    } else {
        std::cout << "FAILED: returned failure\n";
        return 1;
    }

}